

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldd2bdd.c
# Opt level: O0

void run_CALL(WorkerP *w,Task *__dq_head)

{
  uint32_t value;
  MDD MVar1;
  int *piVar2;
  MDD MVar3;
  char *__s;
  void *pvVar4;
  long lVar5;
  size_t __n;
  MTBDD arg_2;
  set_t psVar6;
  uint uVar7;
  size_t sVar8;
  rel_t prVar9;
  void *pvVar10;
  size_t sVar11;
  FILE *__s_00;
  MTBDD MVar12;
  BDD BVar13;
  MDD MVar14;
  uint32_t *arg_2_00;
  ulong uVar15;
  int iVar16;
  double dVar17;
  lddmc_satcount_double_t lVar18;
  uint32_t auStack_190 [2];
  uint32_t auStack_188 [3];
  uint local_17c;
  double local_178;
  ulong local_170;
  size_t local_168;
  size_t local_160;
  double local_158;
  ulong local_150;
  void *local_148;
  uint32_t *local_140;
  uint local_134;
  long local_130;
  undefined1 *local_128;
  Task *local_120;
  Task *__dq_head_local;
  WorkerP *w_local;
  int local_108;
  uint32_t len_1;
  int i_13;
  int k_1;
  MTBDD test2;
  MDD succ;
  MTBDD test;
  MTBDD new_vars;
  MTBDD new_rel;
  int i_12;
  int i_11;
  MTBDD new_states;
  MTBDD MStack_c0;
  int k;
  MTBDD new_initial;
  MTBDD MStack_b0;
  int i_10;
  MTBDD state_vars;
  int local_a0;
  int i_9;
  int totalbits;
  int i_8;
  MDD bits_dd;
  int i_7;
  int i_6;
  unsigned_long __vla_expr2;
  uint32_t local_78;
  int i_5;
  uint32_t highest_action;
  int i_4;
  unsigned_long __vla_expr1;
  uint local_60;
  int i_3;
  uint32_t len;
  int i_2;
  unsigned_long __vla_expr0;
  uint local_44;
  set_t psStack_40;
  int action_labels_count;
  set_t states;
  int local_30;
  int has_reachable;
  int i_1;
  int i;
  set_t initial;
  FILE *f;
  WorkerP *local_10;
  
  local_128 = (undefined1 *)auStack_188;
  auStack_190[0] = 0x10421c;
  auStack_190[1] = 0;
  local_120 = __dq_head;
  __dq_head_local = (Task *)w;
  f = (FILE *)__dq_head;
  local_10 = w;
  initial = (set_t)fopen(model_filename,"rb");
  if ((FILE *)initial == (FILE *)0x0) {
    auStack_190[0] = 0x104246;
    auStack_190[1] = 0;
    fprintf(_stderr,"Cannot open file \'%s\'!\n",model_filename);
    auStack_190[0] = 0x104263;
    auStack_190[1] = 0;
    fprintf(_stderr,"Abort at line %d!\n",0x220);
    auStack_190[0] = 0x10426d;
    auStack_190[1] = 0;
    exit(-1);
  }
  auStack_190[0] = 0x104287;
  auStack_190[1] = 0;
  sVar8 = fread(&vector_size,4,1,(FILE *)initial);
  if (sVar8 != 1) {
    auStack_190[0] = 0x1042a5;
    auStack_190[1] = 0;
    fprintf(_stderr,"Invalid input file!\n");
    auStack_190[0] = 0x1042c2;
    auStack_190[1] = 0;
    fprintf(_stderr,"Abort at line %d!\n",0x223);
    auStack_190[0] = 0x1042cc;
    auStack_190[1] = 0;
    exit(-1);
  }
  if (verbose != 0) {
    auStack_190[0] = 0x1042e3;
    auStack_190[1] = 0;
    printf("Loading initial state.\n");
  }
  auStack_190[0] = 0x1042ec;
  auStack_190[1] = 0;
  _i_1 = set_load_RUN((FILE *)initial);
  auStack_190[0] = 0x10430a;
  auStack_190[1] = 0;
  sVar8 = fread(&next_count,4,1,(FILE *)initial);
  if (sVar8 != 1) {
    auStack_190[0] = 0x104328;
    auStack_190[1] = 0;
    fprintf(_stderr,"Invalid input file!\n");
    auStack_190[0] = 0x104345;
    auStack_190[1] = 0;
    fprintf(_stderr,"Abort at line %d!\n",0x22a);
    auStack_190[0] = 0x10434f;
    auStack_190[1] = 0;
    exit(-1);
  }
  auStack_190[0] = 0x10435f;
  auStack_190[1] = 0;
  next = (rel_t *)malloc((long)next_count << 3);
  if (verbose != 0) {
    auStack_190[0] = 0x10437d;
    auStack_190[1] = 0;
    printf("Loading transition relations.\n");
  }
  for (has_reachable = 0; has_reachable < next_count; has_reachable = has_reachable + 1) {
    auStack_190[0] = 0x104398;
    auStack_190[1] = 0;
    prVar9 = rel_load_proj_RUN((FILE *)initial);
    next[has_reachable] = prVar9;
  }
  for (local_30 = 0; local_30 < next_count; local_30 = local_30 + 1) {
    auStack_190[0] = 0x1043df;
    auStack_190[1] = 0;
    rel_load_RUN((FILE *)initial,next[local_30]);
  }
  states._4_4_ = 0;
  auStack_190[0] = 0x104408;
  auStack_190[1] = 0;
  sVar8 = fread((void *)((long)&states + 4),4,1,(FILE *)initial);
  if (sVar8 != 1) {
    auStack_190[0] = 0x104426;
    auStack_190[1] = 0;
    fprintf(_stderr,"Input file missing reachable states!\n");
    auStack_190[0] = 0x104443;
    auStack_190[1] = 0;
    fprintf(_stderr,"Abort at line %d!\n",0x234);
    auStack_190[0] = 0x10444d;
    auStack_190[1] = 0;
    exit(-1);
  }
  if (states._4_4_ == 0) {
    auStack_190[0] = 0x10446b;
    auStack_190[1] = 0;
    fprintf(_stderr,"Input file missing reachable states!\n");
    auStack_190[0] = 0x104488;
    auStack_190[1] = 0;
    fprintf(_stderr,"Abort at line %d!\n",0x235);
    auStack_190[0] = 0x104492;
    auStack_190[1] = 0;
    exit(-1);
  }
  if (verbose != 0) {
    auStack_190[0] = 0x1044a9;
    auStack_190[1] = 0;
    printf("Loading reachable states.\n");
  }
  auStack_190[0] = 0x1044b2;
  auStack_190[1] = 0;
  psStack_40 = set_load_RUN((FILE *)initial);
  local_44 = 0;
  auStack_190[0] = 0x1044d4;
  auStack_190[1] = 0;
  sVar8 = fread(&local_44,4,1,(FILE *)initial);
  if (sVar8 != 1) {
    local_44 = 0;
  }
  _len = (ulong)local_44;
  lVar5 = -(_len * 8 + 0xf & 0xfffffffffffffff0);
  local_130 = (long)auStack_188 + lVar5;
  __vla_expr0 = (unsigned_long)auStack_188;
  for (i_3 = 0; psVar6 = initial, i_3 < (int)local_44; i_3 = i_3 + 1) {
    *(undefined8 *)((long)auStack_188 + lVar5 + -8) = 0x104535;
    sVar8 = fread(&local_60,4,1,(FILE *)psVar6);
    if (sVar8 != 1) {
      *(undefined8 *)((long)auStack_188 + lVar5 + -8) = 0x104553;
      fprintf(_stderr,"Invalid input file!\n");
      *(undefined8 *)((long)auStack_188 + lVar5 + -8) = 0x104570;
      fprintf(_stderr,"Abort at line %d!\n",0x244);
      *(undefined8 *)((long)auStack_188 + lVar5 + -8) = 0x10457a;
      exit(-1);
    }
    uVar7 = local_60 + 1;
    *(undefined8 *)((long)auStack_188 + lVar5 + -8) = 0x104589;
    pvVar10 = malloc((ulong)uVar7);
    psVar6 = initial;
    *(void **)(local_130 + (long)i_3 * 8) = pvVar10;
    pvVar10 = *(void **)(local_130 + (long)i_3 * 8);
    uVar15 = (ulong)local_60;
    *(undefined8 *)((long)auStack_188 + lVar5 + -8) = 0x1045b6;
    sVar8 = fread(pvVar10,1,uVar15,(FILE *)psVar6);
    if (sVar8 != local_60) {
      *(undefined8 *)((long)auStack_188 + lVar5 + -8) = 0x1045d6;
      fprintf(_stderr,"Invalid input file!\n");
      *(undefined8 *)((long)auStack_188 + lVar5 + -8) = 0x1045f3;
      fprintf(_stderr,"Abort at line %d!\n",0x246);
      *(undefined8 *)((long)auStack_188 + lVar5 + -8) = 0x1045fd;
      exit(-1);
    }
    *(undefined1 *)(*(long *)(local_130 + (long)i_3 * 8) + (ulong)local_60) = 0;
  }
  *(undefined8 *)((long)auStack_188 + lVar5 + -8) = 0x10462a;
  fclose((FILE *)psVar6);
  *(undefined8 *)((long)auStack_188 + lVar5 + -8) = 0x10463f;
  printf("Read file %s.\n",model_filename);
  if (verbose != 0) {
    *(undefined8 *)((long)auStack_188 + lVar5 + -8) = 0x104666;
    printf("%d integers per state, %d transition groups\n",(ulong)(uint)vector_size,
           (ulong)(uint)next_count);
    *(undefined8 *)((long)auStack_188 + lVar5 + -8) = 0x104674;
    printf("LDD nodes:\n");
    MVar14 = _i_1->dd;
    *(undefined8 *)((long)auStack_188 + lVar5 + -8) = 0x104680;
    sVar11 = lddmc_nodecount(MVar14);
    *(undefined8 *)((long)auStack_188 + lVar5 + -8) = 0x104691;
    printf("Initial states: %zu LDD nodes\n",sVar11);
    for (__vla_expr1._4_4_ = 0; (int)__vla_expr1._4_4_ < next_count;
        __vla_expr1._4_4_ = __vla_expr1._4_4_ + 1) {
      local_134 = __vla_expr1._4_4_;
      MVar14 = next[(int)__vla_expr1._4_4_]->dd;
      *(undefined8 *)((long)auStack_188 + lVar5 + -8) = 0x1046c3;
      sVar11 = lddmc_nodecount(MVar14);
      uVar15 = (ulong)local_134;
      *(undefined8 *)((long)auStack_188 + lVar5 + -8) = 0x1046da;
      printf("Transition %d: %zu LDD nodes\n",uVar15,sVar11);
    }
  }
  if (verbose != 0) {
    *(undefined8 *)((long)auStack_188 + lVar5 + -8) = 0x1046fe;
    printf("Preparing conversion to BDD...\n");
  }
  _highest_action = (ulong)(uint)vector_size;
  arg_2_00 = (uint32_t *)
             (((long)auStack_188 + lVar5) - (_highest_action * 4 + 0xf & 0xfffffffffffffff0));
  for (i_5 = 0; i_5 < vector_size; i_5 = i_5 + 1) {
    arg_2_00[i_5] = 0;
  }
  MVar14 = psStack_40->dd;
  local_140 = arg_2_00;
  arg_2_00[-2] = 0x104766;
  arg_2_00[-1] = 0;
  compute_highest_RUN(MVar14,arg_2_00);
  local_78 = 0;
  for (__vla_expr2._4_4_ = 0; __vla_expr2._4_4_ < next_count;
      __vla_expr2._4_4_ = __vla_expr2._4_4_ + 1) {
    MVar14 = next[__vla_expr2._4_4_]->dd;
    MVar1 = next[__vla_expr2._4_4_]->meta;
    arg_2_00[-2] = 0x1047ad;
    arg_2_00[-1] = 0;
    compute_highest_action_RUN(MVar14,MVar1,&local_78);
  }
  _i_7 = (ulong)(uint)vector_size;
  pvVar10 = (void *)((long)arg_2_00 - (_i_7 * 4 + 0xf & 0xfffffffffffffff0));
  for (bits_dd._4_4_ = 0; bits_dd._4_4_ < vector_size; bits_dd._4_4_ = bits_dd._4_4_ + 1) {
    *(undefined4 *)((long)pvVar10 + (long)bits_dd._4_4_ * 4) = 0;
    while (local_140[bits_dd._4_4_] != 0) {
      *(int *)((long)pvVar10 + (long)bits_dd._4_4_ * 4) =
           *(int *)((long)pvVar10 + (long)bits_dd._4_4_ * 4) + 1;
      local_140[bits_dd._4_4_] = local_140[bits_dd._4_4_] >> 1;
    }
    if (*(int *)((long)pvVar10 + (long)bits_dd._4_4_ * 4) == 0) {
      *(undefined4 *)((long)pvVar10 + (long)bits_dd._4_4_ * 4) = 1;
    }
  }
  actionbits = 0;
  for (; local_78 != 0; local_78 = local_78 >> 1) {
    actionbits = actionbits + 1;
  }
  if ((actionbits == 0) && (has_actions != 0)) {
    actionbits = 1;
  }
  local_148 = pvVar10;
  if (verbose != 0) {
    *(undefined8 *)((long)pvVar10 + -8) = 0x1048ef;
    printf("Bits per level: ");
    for (bits_dd._0_4_ = 0; (int)bits_dd < vector_size; bits_dd._0_4_ = (int)bits_dd + 1) {
      if (0 < (int)bits_dd) {
        *(undefined8 *)((long)pvVar10 + -8) = 0x10491e;
        printf(", ");
      }
      uVar7 = *(uint *)((long)local_148 + (long)(int)bits_dd * 4);
      *(undefined8 *)((long)pvVar10 + -8) = 0x10493d;
      printf("%d",(ulong)uVar7);
    }
    *(undefined8 *)((long)pvVar10 + -8) = 0x10495c;
    printf("\n");
    *(undefined8 *)((long)pvVar10 + -8) = 0x104970;
    printf("Action bits: %d.\n",(ulong)(uint)actionbits);
  }
  _totalbits = 1;
  for (i_9 = 0; MVar14 = _totalbits, i_9 < vector_size; i_9 = i_9 + 1) {
    value = *(uint32_t *)((long)local_148 + (long)((vector_size - i_9) + -1) * 4);
    *(undefined8 *)((long)pvVar10 + -8) = 0x1049bf;
    _totalbits = lddmc_makenode(value,MVar14,0);
  }
  *(undefined8 *)((long)pvVar10 + -8) = 0x1049e3;
  lddmc_ref(MVar14);
  local_a0 = 0;
  for (state_vars._4_4_ = 0; state_vars._4_4_ < vector_size; state_vars._4_4_ = state_vars._4_4_ + 1
      ) {
    local_a0 = *(int *)((long)local_148 + (long)state_vars._4_4_ * 4) + local_a0;
  }
  MStack_b0 = 0x8000000000000000;
  for (new_initial._4_4_ = 0; MVar12 = MStack_b0, new_initial._4_4_ < local_a0;
      new_initial._4_4_ = new_initial._4_4_ + 1) {
    iVar16 = local_a0 - new_initial._4_4_;
    *(undefined8 *)((long)pvVar10 + -8) = 0x104a7d;
    MStack_b0 = mtbdd_makenode((iVar16 + -1) * 2,0,MVar12);
  }
  *(undefined8 *)((long)pvVar10 + -8) = 0x104aa1;
  mtbdd_protect(&stack0xffffffffffffff50);
  if (verbose != 0) {
    *(undefined8 *)((long)pvVar10 + -8) = 0x104ab8;
    printf("Converting to BDD...\n");
  }
  *(undefined8 *)((long)pvVar10 + -8) = 0x104acb;
  __s_00 = fopen(bdd_filename,"w");
  initial = (set_t)__s_00;
  if (__s_00 == (FILE *)0x0) {
    *(undefined8 *)((long)pvVar10 + -8) = 0x104af5;
    fprintf(_stderr,"Cannot open file \'%s\'!\n",bdd_filename);
    *(undefined8 *)((long)pvVar10 + -8) = 0x104b12;
    fprintf(_stderr,"Abort at line %d!\n",0x29f);
    *(undefined8 *)((long)pvVar10 + -8) = 0x104b1c;
    exit(-1);
  }
  local_168 = 4;
  local_160 = 1;
  *(undefined8 *)((long)pvVar10 + -8) = 0x104b44;
  fwrite(&vector_size,4,1,__s_00);
  psVar6 = initial;
  pvVar4 = local_148;
  sVar8 = local_168;
  *(undefined8 *)((long)pvVar10 + -8) = 0x104b62;
  fwrite(pvVar4,sVar8,(long)vector_size,(FILE *)psVar6);
  psVar6 = initial;
  __n = local_160;
  sVar8 = local_168;
  *(undefined8 *)((long)pvVar10 + -8) = 0x104b80;
  fwrite(&actionbits,sVar8,__n,(FILE *)psVar6);
  MVar1 = _totalbits;
  MVar14 = _i_1->dd;
  *(undefined8 *)((long)pvVar10 + -8) = 0x104b95;
  MVar12 = bdd_from_ldd_RUN(MVar14,MVar1,0);
  sVar11 = (size_t)local_a0;
  MStack_c0 = MVar12;
  *(undefined8 *)((long)pvVar10 + -8) = 0x104baf;
  dVar17 = mtbdd_satcount_RUN(MVar12,sVar11);
  local_158 = 9.223372036854776e+18;
  local_150 = (long)dVar17 | (long)(dVar17 - 9.223372036854776e+18) & (long)dVar17 >> 0x3f;
  MVar14 = _i_1->dd;
  *(undefined8 *)((long)pvVar10 + -8) = 0x104bf0;
  lVar18 = lddmc_satcount_cached_RUN(MVar14);
  MVar12 = MStack_c0;
  if (local_150 != ((long)lVar18 | (long)(lVar18 - local_158) & (long)lVar18 >> 0x3f)) {
    *(undefined8 *)((long)pvVar10 + -8) = 0x104d2e;
    __assert_fail("(size_t)mtbdd_satcount(new_initial, totalbits) == (size_t)lddmc_satcount_cached(initial->dd)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/examples/ldd2bdd.c"
                  ,0x2a8,"void run_WORK(WorkerP *, Task *)");
  }
  *(undefined8 *)((long)pvVar10 + -8) = 0x104c32;
  mtbdd_refs_push(MVar12);
  psVar6 = initial;
  new_states._4_4_ = 0xffffffff;
  *(undefined8 *)((long)pvVar10 + -8) = 0x104c56;
  fwrite((void *)((long)&new_states + 4),4,1,(FILE *)psVar6);
  psVar6 = initial;
  *(undefined8 *)((long)pvVar10 + -8) = 0x104c6b;
  mtbdd_writer_tobinary_RUN((FILE *)psVar6,&stack0xffffffffffffff40,1);
  MVar1 = _totalbits;
  MVar14 = psStack_40->dd;
  *(undefined8 *)((long)pvVar10 + -8) = 0x104c80;
  MVar12 = bdd_from_ldd_RUN(MVar14,MVar1,0);
  sVar11 = (size_t)local_a0;
  _i_12 = MVar12;
  *(undefined8 *)((long)pvVar10 + -8) = 0x104c9a;
  dVar17 = mtbdd_satcount_RUN(MVar12,sVar11);
  local_178 = 9.223372036854776e+18;
  local_170 = (long)dVar17 | (long)(dVar17 - 9.223372036854776e+18) & (long)dVar17 >> 0x3f;
  MVar14 = psStack_40->dd;
  *(undefined8 *)((long)pvVar10 + -8) = 0x104cdb;
  lVar18 = lddmc_satcount_cached_RUN(MVar14);
  MVar12 = _i_12;
  if (local_170 == ((long)lVar18 | (long)(lVar18 - local_178) & (long)lVar18 >> 0x3f)) {
    *(undefined8 *)((long)pvVar10 + -8) = 0x104d3a;
    mtbdd_refs_push(MVar12);
    MVar12 = MStack_c0;
    if (verbose != 0) {
      *(undefined8 *)((long)pvVar10 + -8) = 0x104d70;
      sVar11 = mtbdd_nodecount(MVar12);
      *(undefined8 *)((long)pvVar10 + -8) = 0x104d81;
      printf("Initial states: %zu BDD nodes\n",sVar11);
      MVar12 = _i_12;
      *(undefined8 *)((long)pvVar10 + -8) = 0x104d8d;
      sVar11 = mtbdd_nodecount(MVar12);
      *(undefined8 *)((long)pvVar10 + -8) = 0x104d9e;
      printf("Reachable states: %zu BDD nodes\n",sVar11);
    }
    psVar6 = initial;
    *(undefined8 *)((long)pvVar10 + -8) = 0x104db8;
    fwrite(&next_count,4,1,(FILE *)psVar6);
    for (new_rel._4_4_ = 0; psVar6 = initial, new_rel._4_4_ < next_count;
        new_rel._4_4_ = new_rel._4_4_ + 1) {
      prVar9 = next[new_rel._4_4_];
      *(undefined8 *)((long)pvVar10 + -8) = 0x104dfd;
      fwrite(&prVar9->r_k,4,1,(FILE *)psVar6);
      psVar6 = initial;
      prVar9 = next[new_rel._4_4_];
      *(undefined8 *)((long)pvVar10 + -8) = 0x104e26;
      fwrite(&prVar9->w_k,4,1,(FILE *)psVar6);
      psVar6 = initial;
      piVar2 = next[new_rel._4_4_]->r_proj;
      iVar16 = next[new_rel._4_4_]->r_k;
      *(undefined8 *)((long)pvVar10 + -8) = 0x104e60;
      fwrite(piVar2,4,(long)iVar16,(FILE *)psVar6);
      psVar6 = initial;
      piVar2 = next[new_rel._4_4_]->w_proj;
      iVar16 = next[new_rel._4_4_]->w_k;
      *(undefined8 *)((long)pvVar10 + -8) = 0x104e9a;
      fwrite(piVar2,4,(long)iVar16,(FILE *)psVar6);
    }
    new_rel._0_4_ = 0;
    do {
      psVar6 = initial;
      MVar14 = _totalbits;
      if (next_count <= (int)(uint)new_rel) {
        if (no_reachable != 0) {
          states._4_4_ = 0;
        }
        *(undefined8 *)((long)pvVar10 + -8) = 0x1050e4;
        fwrite((void *)((long)&states + 4),4,1,(FILE *)psVar6);
        psVar6 = initial;
        if (states._4_4_ != 0) {
          len_1 = 0xffffffff;
          *(undefined8 *)((long)pvVar10 + -8) = 0x10510e;
          fwrite(&len_1,4,1,(FILE *)psVar6);
          psVar6 = initial;
          *(undefined8 *)((long)pvVar10 + -8) = 0x105123;
          mtbdd_writer_tobinary_RUN((FILE *)psVar6,(MTBDD *)&i_12,1);
        }
        *(undefined8 *)((long)pvVar10 + -8) = 0x10512d;
        mtbdd_refs_pop(1);
        psVar6 = initial;
        *(undefined8 *)((long)pvVar10 + -8) = 0x105144;
        fwrite(&local_44,4,1,(FILE *)psVar6);
        for (local_108 = 0; psVar6 = initial, local_108 < (int)local_44; local_108 = local_108 + 1)
        {
          __s = *(char **)(local_130 + (long)local_108 * 8);
          *(undefined8 *)((long)pvVar10 + -8) = 0x105170;
          sVar8 = strlen(__s);
          psVar6 = initial;
          w_local._4_4_ = (uint)sVar8;
          *(undefined8 *)((long)pvVar10 + -8) = 0x105190;
          fwrite((void *)((long)&w_local + 4),4,1,(FILE *)psVar6);
          psVar6 = initial;
          pvVar4 = *(void **)(local_130 + (long)local_108 * 8);
          uVar15 = (ulong)w_local._4_4_;
          *(undefined8 *)((long)pvVar10 + -8) = 0x1051b8;
          fwrite(pvVar4,1,uVar15,(FILE *)psVar6);
        }
        *(undefined8 *)((long)pvVar10 + -8) = 0x1051d2;
        fclose((FILE *)psVar6);
        *(undefined8 *)((long)pvVar10 + -8) = 0x1051e7;
        printf("Written file %s.\n",bdd_filename);
        return;
      }
      MVar1 = next[(int)(uint)new_rel]->dd;
      MVar3 = next[(int)(uint)new_rel]->meta;
      *(undefined8 *)((long)pvVar10 + -8) = 0x104f03;
      MVar12 = bdd_from_ldd_rel_RUN(MVar1,MVar14,0,MVar3);
      new_vars = MVar12;
      *(undefined8 *)((long)pvVar10 + -8) = 0x104f16;
      mtbdd_refs_push(MVar12);
      psVar6 = initial;
      *(undefined8 *)((long)pvVar10 + -8) = 0x104f2b;
      mtbdd_writer_tobinary_RUN((FILE *)psVar6,&new_vars,1);
      MVar12 = new_vars;
      if (verbose != 0) {
        local_17c = (uint)new_rel;
        *(undefined8 *)((long)pvVar10 + -8) = 0x104f4c;
        sVar11 = mtbdd_nodecount(MVar12);
        uVar15 = (ulong)local_17c;
        *(undefined8 *)((long)pvVar10 + -8) = 0x104f63;
        printf("Transition %d: %zu BDD nodes\n",uVar15,sVar11);
      }
      MVar14 = _totalbits;
      if (check_results != 0) {
        MVar1 = next[(int)(uint)new_rel]->meta;
        *(undefined8 *)((long)pvVar10 + -8) = 0x104f94;
        MVar12 = meta_to_bdd(MVar1,MVar14,0);
        test = MVar12;
        *(undefined8 *)((long)pvVar10 + -8) = 0x104fa7;
        mtbdd_refs_push(MVar12);
        BVar13 = _i_12;
        arg_2 = new_vars;
        MVar12 = test;
        *(undefined8 *)((long)pvVar10 + -8) = 0x104fc3;
        BVar13 = sylvan_relnext_RUN(BVar13,arg_2,MVar12,0);
        succ = BVar13;
        *(undefined8 *)((long)pvVar10 + -8) = 0x104fd6;
        mtbdd_refs_push(BVar13);
        MVar14 = psStack_40->dd;
        MVar1 = next[(int)(uint)new_rel]->dd;
        MVar3 = next[(int)(uint)new_rel]->meta;
        *(undefined8 *)((long)pvVar10 + -8) = 0x10500d;
        MVar14 = lddmc_relprod_RUN(MVar14,MVar1,MVar3);
        test2 = MVar14;
        *(undefined8 *)((long)pvVar10 + -8) = 0x105020;
        lddmc_refs_push(MVar14);
        MVar14 = _totalbits;
        MVar12 = test2;
        *(undefined8 *)((long)pvVar10 + -8) = 0x105035;
        _i_13 = bdd_from_ldd_RUN(MVar12,MVar14,0);
        if (succ != _i_13) {
          *(undefined8 *)((long)pvVar10 + -8) = 0x105064;
          fprintf(_stderr,"Conversion error!\n");
          *(undefined8 *)((long)pvVar10 + -8) = 0x105081;
          fprintf(_stderr,"Abort at line %d!\n",0x2db);
          *(undefined8 *)((long)pvVar10 + -8) = 0x10508b;
          exit(-1);
        }
        *(undefined8 *)((long)pvVar10 + -8) = 0x105095;
        lddmc_refs_pop(1);
        *(undefined8 *)((long)pvVar10 + -8) = 0x10509f;
        mtbdd_refs_pop(2);
      }
      *(undefined8 *)((long)pvVar10 + -8) = 0x1050a9;
      mtbdd_refs_pop(1);
      new_rel._0_4_ = (uint)new_rel + 1;
    } while( true );
  }
  *(undefined8 *)((long)pvVar10 + -8) = 0x104d64;
  __assert_fail("(size_t)mtbdd_satcount(new_states, totalbits) == (size_t)lddmc_satcount_cached(states->dd)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/examples/ldd2bdd.c"
                ,0x2b2,"void run_WORK(WorkerP *, Task *)");
}

Assistant:

VOID_TASK_0(run)
{
    // Open file
    FILE *f = fopen(model_filename, "rb");
    if (f == NULL) Abort("Cannot open file '%s'!\n", model_filename);

    // Read integers per vector
    if (fread(&vector_size, sizeof(int), 1, f) != 1) Abort("Invalid input file!\n");

    // Read initial state
    if (verbose) printf("Loading initial state.\n");
    set_t initial = set_load(f);

    // Read number of transitions
    if (fread(&next_count, sizeof(int), 1, f) != 1) Abort("Invalid input file!\n");
    next = (rel_t*)malloc(sizeof(rel_t) * next_count);

    // Read transitions
    if (verbose) printf("Loading transition relations.\n");
    for (int i=0; i<next_count; i++) next[i] = rel_load_proj(f);
    for (int i=0; i<next_count; i++) rel_load(f, next[i]);

    // Read whether reachable states are stored
    int has_reachable = 0;
    if (fread(&has_reachable, sizeof(int), 1, f) != 1) Abort("Input file missing reachable states!\n");
    if (has_reachable == 0) Abort("Input file missing reachable states!\n");

    // Read reachable states
    if (verbose) printf("Loading reachable states.\n");
    set_t states = set_load(f);
    
    // Read number of action labels
    int action_labels_count = 0;
    if (fread(&action_labels_count, sizeof(int), 1, f) != 1) action_labels_count = 0;
    // ignore: Abort("Input file missing action label count!\n");

    // Read action labels
    char *action_labels[action_labels_count];
    for (int i=0; i<action_labels_count; i++) {
        uint32_t len;
        if (fread(&len, sizeof(uint32_t), 1, f) != 1) Abort("Invalid input file!\n");
        action_labels[i] = (char*)malloc(sizeof(char[len+1]));
        if (fread(action_labels[i], sizeof(char), len, f) != len) Abort("Invalid input file!\n");
        action_labels[i][len] = 0;
    }

    // Close file
    fclose(f);

    // Report that we have read the input file
    printf("Read file %s.\n", model_filename);

    // Report statistics
    if (verbose) {
        printf("%d integers per state, %d transition groups\n", vector_size, next_count);
        printf("LDD nodes:\n");
        printf("Initial states: %zu LDD nodes\n", lddmc_nodecount(initial->dd));
        for (int i=0; i<next_count; i++) {
            printf("Transition %d: %zu LDD nodes\n", i, lddmc_nodecount(next[i]->dd));
        }
    }

    // Report that we prepare BDD conversion
    if (verbose) printf("Preparing conversion to BDD...\n");

    // Compute highest value at each level (from reachable states)
    uint32_t highest[vector_size];
    for (int i=0; i<vector_size; i++) highest[i] = 0;
    compute_highest(states->dd, highest);

    // Compute highest action label value (from transition relations)
    uint32_t highest_action = 0;
    for (int i=0; i<next_count; i++) {
        compute_highest_action(next[i]->dd, next[i]->meta, &highest_action);
    }

    // Compute number of bits for each level
    int bits[vector_size];
    for (int i=0; i<vector_size; i++) {
        bits[i] = 0;
        while (highest[i] != 0) {
            bits[i]++;
            highest[i]>>=1;
        }
        if (bits[i] == 0) bits[i] = 1;
    }

    // Compute number of bits for action label
    actionbits = 0;
    while (highest_action != 0) {
        actionbits++;
        highest_action>>=1;
    }
    if (actionbits == 0 && has_actions) actionbits = 1;

    // Report number of bits
    if (verbose) {
        printf("Bits per level: ");
        for (int i=0; i<vector_size; i++) {
            if (i>0) printf(", ");
            printf("%d", bits[i]);
        }
        printf("\n");
        printf("Action bits: %d.\n", actionbits);
    }

    // Compute bits MDD
    MDD bits_dd = lddmc_true;
    for (int i=0; i<vector_size; i++) {
        bits_dd = lddmc_makenode(bits[vector_size-i-1], bits_dd, lddmc_false);
    }
    lddmc_ref(bits_dd);

    // Compute total number of bits
    int totalbits = 0;
    for (int i=0; i<vector_size; i++) {
        totalbits += bits[i];
    }

    // Compute state variables
    MTBDD state_vars = mtbdd_true;
    for (int i=0; i<totalbits; i++) {
        state_vars = mtbdd_makenode(2*(totalbits-i-1), mtbdd_false, state_vars);
    }
    mtbdd_protect(&state_vars);

    // Report that we begin the actual conversion
    if (verbose) printf("Converting to BDD...\n");

    // Create BDD file
    f = fopen(bdd_filename, "w");
    if (f == NULL) Abort("Cannot open file '%s'!\n", bdd_filename);

    // Write domain...
    fwrite(&vector_size, sizeof(int), 1, f);
    fwrite(bits, sizeof(int), vector_size, f);
    fwrite(&actionbits, sizeof(int), 1, f);

    // Write initial state...
    MTBDD new_initial = bdd_from_ldd(initial->dd, bits_dd, 0);
    assert((size_t)mtbdd_satcount(new_initial, totalbits) == (size_t)lddmc_satcount_cached(initial->dd));
    mtbdd_refs_push(new_initial);
    {
        int k = -1;
        fwrite(&k, sizeof(int), 1, f);
        mtbdd_writer_tobinary(f, &new_initial, 1);
    }

    // Custom operation that converts to BDD given number of bits for each level
    MTBDD new_states = bdd_from_ldd(states->dd, bits_dd, 0);
    assert((size_t)mtbdd_satcount(new_states, totalbits) == (size_t)lddmc_satcount_cached(states->dd));
    mtbdd_refs_push(new_states);

    // Report size of BDD
    if (verbose) {
        printf("Initial states: %zu BDD nodes\n", mtbdd_nodecount(new_initial));
        printf("Reachable states: %zu BDD nodes\n", mtbdd_nodecount(new_states));
    }

    // Write number of transitions
    fwrite(&next_count, sizeof(int), 1, f);

    // Write meta for each transition
    for (int i=0; i<next_count; i++) {
        fwrite(&next[i]->r_k, sizeof(int), 1, f);
        fwrite(&next[i]->w_k, sizeof(int), 1, f);
        fwrite(next[i]->r_proj, sizeof(int), next[i]->r_k, f);
        fwrite(next[i]->w_proj, sizeof(int), next[i]->w_k, f);
    }

    // Write BDD for each transition
    for (int i=0; i<next_count; i++) {
        // Compute new transition relation
        MTBDD new_rel = bdd_from_ldd_rel(next[i]->dd, bits_dd, 0, next[i]->meta);
        mtbdd_refs_push(new_rel);
        mtbdd_writer_tobinary(f, &new_rel, 1);

        // Report number of nodes
        if (verbose) printf("Transition %d: %zu BDD nodes\n", i, mtbdd_nodecount(new_rel));

        if (check_results) {
            // Compute new <variables> for the current transition relation
            MTBDD new_vars = meta_to_bdd(next[i]->meta, bits_dd, 0);
            mtbdd_refs_push(new_vars);

            // Test if the transition is correctly converted
            MTBDD test = sylvan_relnext(new_states, new_rel, new_vars);
            mtbdd_refs_push(test);
            MDD succ = lddmc_relprod(states->dd, next[i]->dd, next[i]->meta);
            lddmc_refs_push(succ);
            MTBDD test2 = bdd_from_ldd(succ, bits_dd, 0);
            if (test != test2) Abort("Conversion error!\n");
            lddmc_refs_pop(1);
            mtbdd_refs_pop(2);
        }

        mtbdd_refs_pop(1);
    }

    // Write reachable states
    if (no_reachable) has_reachable = 0;
    fwrite(&has_reachable, sizeof(int), 1, f);
    if (has_reachable) {
        int k = -1;
        fwrite(&k, sizeof(int), 1, f);
        mtbdd_writer_tobinary(f, &new_states, 1);
    }
    mtbdd_refs_pop(1);  // new_states

    // Write action labels
    fwrite(&action_labels_count, sizeof(int), 1, f);
    for (int i=0; i<action_labels_count; i++) {
        uint32_t len = strlen(action_labels[i]);
        fwrite(&len, sizeof(uint32_t), 1, f);
        fwrite(action_labels[i], sizeof(char), len, f);
    }

    // Close the file
    fclose(f);

    // Report to the user
    printf("Written file %s.\n", bdd_filename);
}